

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t FASTCOVER_ctx_init(FASTCOVER_ctx_t *ctx,void *samplesBuffer,size_t *samplesSizes,
                         uint nbSamples,uint d,double splitPoint,uint f,
                         FASTCOVER_accel_t accelParams)

{
  uint uVar1;
  size_t *psVar2;
  U32 *pUVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  size_t sVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  void *local_38;
  
  uVar6 = (ulong)nbSamples;
  if (nbSamples == 0) {
    uVar10 = 0;
  }
  else {
    uVar5 = 0;
    uVar10 = 0;
    do {
      uVar10 = uVar10 + samplesSizes[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar6 != uVar5);
  }
  uVar5 = (ulong)((double)uVar6 * splitPoint);
  uVar1 = 0;
  if (splitPoint < 1.0) {
    uVar1 = (uint)uVar5;
  }
  uVar11 = (ulong)nbSamples;
  uVar13 = uVar10;
  if (splitPoint < 1.0) {
    uVar11 = uVar5 & 0xffffffff;
    if ((uint)uVar5 == 0) {
      uVar13 = 0;
    }
    else {
      uVar7 = 0;
      uVar13 = 0;
      do {
        uVar13 = uVar13 + samplesSizes[uVar7];
        uVar7 = uVar7 + 1;
      } while ((uVar5 & 0xffffffff) != uVar7);
    }
    if (nbSamples != uVar1) {
      uVar5 = 0;
      do {
        uVar5 = uVar5 + 1;
      } while (nbSamples - uVar1 != uVar5);
    }
  }
  uVar5 = 8;
  if (8 < d) {
    uVar5 = (ulong)d;
  }
  if (uVar10 < uVar5 || 0xfffffffe < uVar10) {
    sVar9 = 0xffffffffffffffb8;
    if (0 < g_displayLevel) {
      FASTCOVER_ctx_init_cold_6();
    }
  }
  else if ((uint)uVar11 < 5) {
    sVar9 = 0xffffffffffffffb8;
    if (0 < g_displayLevel) {
      FASTCOVER_ctx_init_cold_5();
    }
  }
  else if (nbSamples == uVar1) {
    sVar9 = 0xffffffffffffffb8;
    if (0 < g_displayLevel) {
      FASTCOVER_ctx_init_cold_4();
    }
  }
  else {
    ctx->d = 0;
    ctx->f = 0;
    (ctx->accelParams).finalize = 0;
    (ctx->accelParams).skip = 0;
    ctx->nbDmers = 0;
    ctx->freqs = (U32 *)0x0;
    ctx->nbTrainSamples = 0;
    ctx->nbTestSamples = 0;
    ctx->samplesSizes = (size_t *)0x0;
    ctx->nbSamples = 0;
    ctx->samples = (BYTE *)0x0;
    ctx->offsets = (size_t *)0x0;
    if (1 < g_displayLevel) {
      FASTCOVER_ctx_init_cold_1();
    }
    ctx->samples = (BYTE *)samplesBuffer;
    ctx->samplesSizes = samplesSizes;
    ctx->nbSamples = uVar6;
    ctx->nbTrainSamples = uVar11;
    ctx->nbTestSamples = (ulong)(nbSamples - uVar1);
    ctx->nbDmers = (uVar13 - uVar5) + 1;
    ctx->d = d;
    ctx->f = f;
    ctx->accelParams = accelParams;
    uVar1 = nbSamples + 1;
    psVar2 = (size_t *)calloc((ulong)uVar1,8);
    ctx->offsets = psVar2;
    if (psVar2 == (size_t *)0x0) {
      if (0 < g_displayLevel) {
        FASTCOVER_ctx_init_cold_3();
      }
      free(ctx->freqs);
    }
    else {
      if (nbSamples < 5) {
        __assert_fail("nbSamples >= 5",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xbdae,
                      "size_t FASTCOVER_ctx_init(FASTCOVER_ctx_t *, const void *, const size_t *, unsigned int, unsigned int, double, unsigned int, FASTCOVER_accel_t)"
                     );
      }
      uVar12 = accelParams.skip;
      uVar6 = 2;
      if (2 < uVar1) {
        uVar6 = (ulong)uVar1;
      }
      lVar8 = 0;
      sVar9 = 0;
      do {
        sVar9 = sVar9 + samplesSizes[lVar8];
        psVar2[lVar8 + 1] = sVar9;
        lVar8 = lVar8 + 1;
      } while (uVar6 - 1 != lVar8);
      pUVar3 = (U32 *)calloc(1L << ((byte)f & 0x3f),4);
      ctx->freqs = pUVar3;
      if (pUVar3 != (U32 *)0x0) {
        uVar1 = (uint)uVar5;
        if (1 < g_displayLevel) {
          fwrite("Computing frequencies\n",0x16,1,_stderr);
          fflush(_stderr);
          uVar11 = ctx->nbTrainSamples;
          pUVar3 = ctx->freqs;
          f = ctx->f;
          d = ctx->d;
          uVar12 = (ctx->accelParams).skip;
          uVar1 = 8;
          if (8 < d) {
            uVar1 = d;
          }
        }
        if (4 < uVar11) {
          if (uVar11 <= ctx->nbSamples) {
            uVar6 = 0;
            do {
              sVar9 = ctx->offsets[uVar6];
              uVar10 = ctx->offsets[uVar6 + 1];
              if (uVar1 + sVar9 <= uVar10) {
                do {
                  sVar4 = FASTCOVER_hashPtrToIndex(ctx->samples + sVar9,f,d);
                  pUVar3[sVar4] = pUVar3[sVar4] + 1;
                  sVar9 = sVar9 + (ulong)uVar12 + 1;
                } while (uVar1 + sVar9 <= uVar10);
                uVar11 = ctx->nbTrainSamples;
              }
              uVar6 = uVar6 + 1;
            } while (uVar6 < uVar11);
            return 0;
          }
          __assert_fail("ctx->nbTrainSamples <= ctx->nbSamples",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xbd5b,"void FASTCOVER_computeFrequency(U32 *, const FASTCOVER_ctx_t *)");
        }
        __assert_fail("ctx->nbTrainSamples >= 5",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xbd5a,"void FASTCOVER_computeFrequency(U32 *, const FASTCOVER_ctx_t *)");
      }
      if (g_displayLevel < 1) {
        local_38 = (void *)0x0;
      }
      else {
        FASTCOVER_ctx_init_cold_2();
      }
      free(local_38);
    }
    ctx->freqs = (U32 *)0x0;
    free(ctx->offsets);
    ctx->offsets = (size_t *)0x0;
    sVar9 = 0xffffffffffffffc0;
  }
  return sVar9;
}

Assistant:

static size_t
FASTCOVER_ctx_init(FASTCOVER_ctx_t* ctx,
                   const void* samplesBuffer,
                   const size_t* samplesSizes, unsigned nbSamples,
                   unsigned d, double splitPoint, unsigned f,
                   FASTCOVER_accel_t accelParams)
{
    const BYTE* const samples = (const BYTE*)samplesBuffer;
    const size_t totalSamplesSize = COVER_sum(samplesSizes, nbSamples);
    /* Split samples into testing and training sets */
    const unsigned nbTrainSamples = splitPoint < 1.0 ? (unsigned)((double)nbSamples * splitPoint) : nbSamples;
    const unsigned nbTestSamples = splitPoint < 1.0 ? nbSamples - nbTrainSamples : nbSamples;
    const size_t trainingSamplesSize = splitPoint < 1.0 ? COVER_sum(samplesSizes, nbTrainSamples) : totalSamplesSize;
    const size_t testSamplesSize = splitPoint < 1.0 ? COVER_sum(samplesSizes + nbTrainSamples, nbTestSamples) : totalSamplesSize;

    /* Checks */
    if (totalSamplesSize < MAX(d, sizeof(U64)) ||
        totalSamplesSize >= (size_t)FASTCOVER_MAX_SAMPLES_SIZE) {
        DISPLAYLEVEL(1, "Total samples size is too large (%u MB), maximum size is %u MB\n",
                    (unsigned)(totalSamplesSize >> 20), (FASTCOVER_MAX_SAMPLES_SIZE >> 20));
        return ERROR(srcSize_wrong);
    }

    /* Check if there are at least 5 training samples */
    if (nbTrainSamples < 5) {
        DISPLAYLEVEL(1, "Total number of training samples is %u and is invalid\n", nbTrainSamples);
        return ERROR(srcSize_wrong);
    }

    /* Check if there's testing sample */
    if (nbTestSamples < 1) {
        DISPLAYLEVEL(1, "Total number of testing samples is %u and is invalid.\n", nbTestSamples);
        return ERROR(srcSize_wrong);
    }

    /* Zero the context */
    memset(ctx, 0, sizeof(*ctx));
    DISPLAYLEVEL(2, "Training on %u samples of total size %u\n", nbTrainSamples,
                    (unsigned)trainingSamplesSize);
    DISPLAYLEVEL(2, "Testing on %u samples of total size %u\n", nbTestSamples,
                    (unsigned)testSamplesSize);

    ctx->samples = samples;
    ctx->samplesSizes = samplesSizes;
    ctx->nbSamples = nbSamples;
    ctx->nbTrainSamples = nbTrainSamples;
    ctx->nbTestSamples = nbTestSamples;
    ctx->nbDmers = trainingSamplesSize - MAX(d, sizeof(U64)) + 1;
    ctx->d = d;
    ctx->f = f;
    ctx->accelParams = accelParams;

    /* The offsets of each file */
    ctx->offsets = (size_t*)calloc((nbSamples + 1), sizeof(size_t));
    if (ctx->offsets == NULL) {
        DISPLAYLEVEL(1, "Failed to allocate scratch buffers \n");
        FASTCOVER_ctx_destroy(ctx);
        return ERROR(memory_allocation);
    }

    /* Fill offsets from the samplesSizes */
    {   U32 i;
        ctx->offsets[0] = 0;
        assert(nbSamples >= 5);
        for (i = 1; i <= nbSamples; ++i) {
            ctx->offsets[i] = ctx->offsets[i - 1] + samplesSizes[i - 1];
        }
    }

    /* Initialize frequency array of size 2^f */
    ctx->freqs = (U32*)calloc(((U64)1 << f), sizeof(U32));
    if (ctx->freqs == NULL) {
        DISPLAYLEVEL(1, "Failed to allocate frequency table \n");
        FASTCOVER_ctx_destroy(ctx);
        return ERROR(memory_allocation);
    }

    DISPLAYLEVEL(2, "Computing frequencies\n");
    FASTCOVER_computeFrequency(ctx->freqs, ctx);

    return 0;
}